

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O0

Am_Value from_sibling_procedure(Am_Object *self)

{
  int iVar1;
  Am_Constraint_Context *pAVar2;
  undefined4 extraout_var;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Slot_Flags in_RSI;
  Am_Value AVar3;
  Am_Object local_48;
  Am_Object local_40 [3];
  Am_Wrapper *local_28;
  Part_Key_Store_Data *store;
  Am_Slot_Flags local_18;
  Am_Object *self_local;
  Am_Value *value;
  
  store._7_1_ = 0;
  local_18 = in_RSI;
  self_local = self;
  Am_Value::Am_Value((Am_Value *)self);
  pAVar2 = Am_Object_Advanced::Get_Context();
  iVar1 = (*pAVar2->_vptr_Am_Constraint_Context[6])();
  local_28 = (Am_Wrapper *)CONCAT44(extraout_var,iVar1);
  Am_Object::Get_Owner(&local_48,local_18);
  Am_Object::Get_Object(local_40,(Am_Slot_Key)&local_48,(ulong)*(ushort *)&local_28->field_0xc);
  in_value = Am_Object::Get(local_40,*(Am_Slot_Key *)&local_28->field_0xe,0);
  Am_Value::operator=((Am_Value *)self,in_value);
  Am_Object::~Am_Object(local_40);
  Am_Object::~Am_Object(&local_48);
  Am_Wrapper::Release(local_28);
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = self;
  return AVar3;
}

Assistant:

static Am_Value
from_sibling_procedure(Am_Object &self)
{
  Am_Value value;
  Part_Key_Store_Data *store =
      (Part_Key_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
  value = self.Get_Owner().Get_Object(store->part).Get(store->key);
  store->Release();
  return value;
}